

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O1

bool __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  mutex *__mutex;
  size_t sVar1;
  int iVar2;
  id tid;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  _Var3;
  system_error *this_00;
  error_category *peVar4;
  undefined8 uVar5;
  error_code __ec;
  
  tid._M_thread = pthread_self();
  __mutex = &this->mtx_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar5 = std::__throw_system_error(iVar2);
    __cxa_free_exception(this);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  if ((this->e_owner_)._M_thread != tid._M_thread) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                      ((this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_finish);
    if (_Var3._M_current ==
        (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      sVar1 = (this->state_).rwcount;
      if (sVar1 == 0) {
        (this->state_).rwcount = 0x8000000000000000;
        (this->e_owner_)._M_thread = tid._M_thread;
        validator::deadlock::locked((uintptr_t)this,tid,false);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return sVar1 == 0;
    }
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar4 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar4;
  __ec._0_8_ = 0x23;
  std::system_error::system_error(this_00,__ec,"recursive try_lock");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

bool try_lock()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive try_lock");
#endif
    }
    if (RwLockPolicy::wait_wlock(state_))
      return false;
    RwLockPolicy::acquire_wlock(state_);
    e_owner_ = tid;
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }